

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tcprs.cpp
# Opt level: O0

CTcPrsNode * __thiscall CTcEmbedBuilderSgl::string_node(CTcEmbedBuilderSgl *this,CTcToken *tok)

{
  CTPNConst *this_00;
  CTcConstVal cval;
  CTcConstVal *this_01;
  CTcToken *in_stack_ffffffffffffffb8;
  CTcConstVal *in_stack_ffffffffffffffc0;
  CTcConstVal local_38;
  
  this_01 = &local_38;
  CTcConstVal::CTcConstVal(this_01);
  CTcConstVal::set_sstr(in_stack_ffffffffffffffc0,in_stack_ffffffffffffffb8);
  this_00 = (CTPNConst *)CTcPrsAllocObj::operator_new(0x2b7644);
  CTPNConst::CTPNConst(this_00,this_01);
  return (CTcPrsNode *)this_00;
}

Assistant:

CTcPrsNode *string_node(const CTcToken *tok)
    {
        CTcConstVal cval;
        cval.set_sstr(tok);
        return new CTPNConst(&cval);
    }